

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_7zip_empty.c
# Opt level: O3

void test_write_format_7zip_empty_archive(void)

{
  int iVar1;
  void *buff;
  archive *_a;
  size_t used;
  size_t local_38;
  
  buff = malloc(1000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'*',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_7zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_open_memory(_a,buff,1000,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  iVar1 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'5',0x20,"32",local_38,"used",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'<',buff,"buff",anon_var_dwarf_10a2f0,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\" \"\\x8d\\x9b\\xd5\\x0f\\x00\\x00\\x00\\x00\" \"\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\" \"\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\""
                      ,0x20,"32",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_7zip_empty_archive)
{
	struct archive *a;
	size_t buffsize = 1000;
	char *buff;
	size_t used;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_7zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the archive file size. */
	assertEqualInt(32, used);

	/* Verify the initial header. */
	assertEqualMem(buff,
		"\x37\x7a\xbc\xaf\x27\x1c\x00\x03"
		"\x8d\x9b\xd5\x0f\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00", 32);

	free(buff);
}